

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

u16string * anon_unknown.dwarf_eb5c::cpputf8_u8_to_u16(u16string *__return_storage_ptr__,string *u8)

{
  utf8 *this;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  in_RCX;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  this = (utf8 *)(u8->_M_dataplus)._M_p;
  utf8::
  utf8to16<std::back_insert_iterator<std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (this,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )(this + u8->_M_string_length),
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

inline
u16string cpputf8_u8_to_u16(const string& u8)
{
    u16string u16;
    utf8::utf8to16(std::begin(u8), std::end(u8), std::back_inserter(u16));
    return u16;
}